

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int convert_wait_status_to_outcome(int status)

{
  int local_c;
  int status_local;
  
  if ((status & 0x7fU) == 0) {
    if ((int)(status & 0xff00U) >> 8 == 0) {
      local_c = 0;
    }
    else {
      local_c = 1;
    }
  }
  else {
    local_c = status;
    if ('\0' < (char)(((byte)status & 0x7f) + 1) >> 1) {
      local_c = 2;
    }
  }
  return local_c;
}

Assistant:

static int convert_wait_status_to_outcome(int status) {
	if (WIFEXITED(status)) {
		if (WEXITSTATUS(status) != 0) {
			return PCUT_OUTCOME_FAIL;
		} else {
			return PCUT_OUTCOME_PASS;
		}
	}

	if (WIFSIGNALED(status)) {
		return PCUT_OUTCOME_INTERNAL_ERROR;
	}

	return status;
}